

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::Write(GB *this,u16 addr,u8 val)

{
  undefined2 in_register_00000032;
  
  (*(code *)(&DAT_0010d8dc +
            *(int *)(&DAT_0010d8dc + (ulong)(CONCAT22(in_register_00000032,addr) >> 0xc) * 4)))();
  return;
}

Assistant:

void GB::Write(u16 addr, u8 val) {
  switch (addr >> 12) {
    case 0: case 1: case 2: case 3: case 4: case 5: case 6: case 7:
      Write_ROM(addr & 0x7fff, val);
      break;
    case 8: case 9: if (!using_vram()) { s.vramp[addr & 0x1fff] = val; } break;
    case 10: case 11:
      if (s.sram_enabled) {
        s.sramp[addr & cart.sram_addr_mask & 0x1fff] = val;
      }
      break;
    case 12: case 14: s.wram0p[addr & 0xfff] = val; break;
    case 13: s.wram1p[addr & 0xfff] = val; break;
    case 15:
      switch ((addr >> 8) & 0xf) {
        default: s.wram1p[addr & 0xfff] = val; break;
        case 14: if (!using_oam()) { s.oam[addr & 0xff] = val; } break;
        case 15: Write_IO(addr & 0xff, val); break;
      }
  }
}